

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

void __thiscall cmListFileBacktrace::PrintTitle(cmListFileBacktrace *this,ostream *out)

{
  bool bVar1;
  cmState *pcVar2;
  char *pcVar3;
  ostream *os;
  cmListFileContext lfc;
  cmOutputConverter converter;
  allocator local_c1;
  string local_c0;
  cmListFileContext local_a0;
  string local_58;
  cmOutputConverter local_38;
  
  if (this->Cur != (Entry *)0x0) {
    cmOutputConverter::cmOutputConverter(&local_38,&this->Bottom);
    cmListFileContext::cmListFileContext(&local_a0,&this->Cur->super_cmListFileContext);
    pcVar2 = cmStateSnapshot::GetState(&this->Bottom);
    bVar1 = cmState::GetIsInTryCompile(pcVar2);
    if (!bVar1) {
      pcVar2 = cmStateSnapshot::GetState(&this->Bottom);
      pcVar3 = cmState::GetSourceDirectory(pcVar2);
      std::__cxx11::string::string((string *)&local_c0,pcVar3,&local_c1);
      cmOutputConverter::ConvertToRelativePath(&local_58,&local_38,&local_c0,&local_a0.FilePath);
      std::__cxx11::string::operator=((string *)&local_a0.FilePath,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    pcVar3 = " at ";
    if (local_a0.Line == 0) {
      pcVar3 = " in ";
    }
    os = std::operator<<(out,pcVar3);
    operator<<(os,&local_a0);
    cmListFileContext::~cmListFileContext(&local_a0);
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintTitle(std::ostream& out) const
{
  if (!this->Cur) {
    return;
  }
  cmOutputConverter converter(this->Bottom);
  cmListFileContext lfc = *this->Cur;
  if (!this->Bottom.GetState()->GetIsInTryCompile()) {
    lfc.FilePath = converter.ConvertToRelativePath(
      this->Bottom.GetState()->GetSourceDirectory(), lfc.FilePath);
  }
  out << (lfc.Line ? " at " : " in ") << lfc;
}